

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O1

_Bool upb_Clone_MessageValue(void *value,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  void *__src;
  upb_Message *puVar1;
  char *__dest;
  ulong uVar2;
  size_t __n;
  _Bool _Var3;
  
  if (value_type < (kUpb_CType_Int64|kUpb_CType_UInt32)) {
    _Var3 = true;
    if ((0x3beU >> (value_type & 0x1f) & 1) == 0) {
      if ((0xc00U >> (value_type & 0x1f) & 1) == 0) {
        if (value_type != kUpb_CType_Message) goto LAB_0030372d;
        uVar2 = *value;
        if (uVar2 == 0) {
          __assert_fail("source",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                        ,0x4e,
                        "_Bool upb_Clone_MessageValue(void *, upb_CType, const upb_MiniTable *, upb_Arena *)"
                       );
        }
        if ((uVar2 & 1) != 0) {
          sub = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
        }
        puVar1 = upb_Message_New(sub,arena);
        puVar1 = _upb_Message_Copy(puVar1,(upb_Message *)(uVar2 & 0xfffffffffffffffe),sub,arena);
        if (((ulong)puVar1 & 1) != 0) {
          __assert_fail("((uintptr_t)ptr & 1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/tagged_ptr.h"
                        ,0x19,
                        "uintptr_t _upb_TaggedMessagePtr_Pack_dont_copy_me__upb_internal_use_only(struct upb_Message *, _Bool)"
                       );
        }
        *(ulong *)value = (ulong)((uint)uVar2 & 1) | (ulong)puVar1;
        _Var3 = puVar1 != (upb_Message *)0x0;
      }
      else {
        __src = *value;
        __n = (size_t)*(int *)((long)value + 8);
        uVar2 = __n + 7 & 0xfffffffffffffff8;
        __dest = arena->ptr_dont_copy_me__upb_internal_use_only;
        if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)__dest) < uVar2) {
          __dest = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,uVar2);
        }
        else {
          if ((char *)((ulong)(__dest + 7) & 0xfffffffffffffff8) != __dest) {
            __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                          ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
          }
          arena->ptr_dont_copy_me__upb_internal_use_only = __dest + uVar2;
        }
        _Var3 = __dest != (char *)0x0;
        if (_Var3) {
          *(char **)value = __dest;
          *(size_t *)((long)value + 8) = __n;
          memcpy(__dest,__src,__n);
          _Var3 = true;
        }
      }
    }
    return _Var3;
  }
LAB_0030372d:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                ,0x56,
                "_Bool upb_Clone_MessageValue(void *, upb_CType, const upb_MiniTable *, upb_Arena *)"
               );
}

Assistant:

static bool upb_Clone_MessageValue(void* value, upb_CType value_type,
                                   const upb_MiniTable* sub, upb_Arena* arena) {
  switch (value_type) {
    case kUpb_CType_Bool:
    case kUpb_CType_Float:
    case kUpb_CType_Int32:
    case kUpb_CType_UInt32:
    case kUpb_CType_Enum:
    case kUpb_CType_Double:
    case kUpb_CType_Int64:
    case kUpb_CType_UInt64:
      return true;
    case kUpb_CType_String:
    case kUpb_CType_Bytes: {
      upb_StringView source = *(upb_StringView*)value;
      int size = source.size;
      void* cloned_data = upb_Arena_Malloc(arena, size);
      if (cloned_data == NULL) {
        return false;
      }
      *(upb_StringView*)value =
          upb_StringView_FromDataAndSize(cloned_data, size);
      memcpy(cloned_data, source.data, size);
      return true;
    } break;
    case kUpb_CType_Message: {
      const upb_TaggedMessagePtr source = *(upb_TaggedMessagePtr*)value;
      bool is_empty = upb_TaggedMessagePtr_IsEmpty(source);
      if (is_empty) sub = UPB_PRIVATE(_upb_MiniTable_Empty)();
      UPB_ASSERT(source);
      upb_Message* clone = upb_Message_DeepClone(
          UPB_PRIVATE(_upb_TaggedMessagePtr_GetMessage)(source), sub, arena);
      *(upb_TaggedMessagePtr*)value =
          UPB_PRIVATE(_upb_TaggedMessagePtr_Pack)(clone, is_empty);
      return clone != NULL;
    } break;
  }
  UPB_UNREACHABLE();
}